

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

ResultBuilder * __thiscall
Catch::ExpressionLhs<std::basic_string_view<char,std::char_traits<char>>const&>::
captureExpression<(Catch::Internal::Operator)0,std::basic_string_view<char,std::char_traits<char>>>
          (ExpressionLhs<std::basic_string_view<char,std::char_traits<char>>const&> *this,
          basic_string_view<char,_std::char_traits<char>_> *rhs)

{
  bool result;
  ResultBuilder *pRVar1;
  basic_string_view<char,_std::char_traits<char>_> *_value;
  basic_string_view<char,_std::char_traits<char>_> *_value_00;
  string local_78;
  string local_58;
  string local_38;
  
  pRVar1 = *(ResultBuilder **)this;
  result = Internal::
           Evaluator<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(Catch::Internal::Operator)0>
           ::evaluate(*(basic_string_view<char,_std::char_traits<char>_> **)(this + 8),rhs);
  pRVar1 = ResultBuilder::setResultType(pRVar1,result);
  Detail::StringMakerBase<true>::convert<std::basic_string_view<char,std::char_traits<char>>>
            (&local_38,*(StringMakerBase<true> **)(this + 8),_value);
  pRVar1 = ResultBuilder::setLhs(pRVar1,&local_38);
  Detail::StringMakerBase<true>::convert<std::basic_string_view<char,std::char_traits<char>>>
            (&local_58,(StringMakerBase<true> *)rhs,_value_00);
  pRVar1 = ResultBuilder::setRhs(pRVar1,&local_58);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"==","");
  pRVar1 = ResultBuilder::setOp(pRVar1,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }